

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall
Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode::~SectionNode(SectionNode *this)

{
  this->_vptr_SectionNode = (_func_int **)&PTR__SectionNode_001b0c78;
  std::__cxx11::string::~string((string *)&this->stdErr);
  std::__cxx11::string::~string((string *)&this->stdOut);
  clara::std::vector<Catch::AssertionStats,_std::allocator<Catch::AssertionStats>_>::~vector
            (&this->assertions);
  clara::std::
  vector<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>,_std::allocator<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>_>_>
  ::~vector(&this->childSections);
  SectionStats::~SectionStats(&this->stats);
  return;
}

Assistant:

virtual ~SectionNode() = default;